

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  vec<Minisat::Lit> *this_00;
  char *pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  undefined8 *puVar7;
  byte bVar8;
  int i_1;
  long lVar9;
  int i;
  long lVar10;
  int i_2;
  lbool result;
  Var v;
  vec<int> extra_frozen;
  
  extra_frozen.data = (int *)0x0;
  extra_frozen.sz = 0;
  extra_frozen.cap = 0;
  result.value = '\0';
  (this->super_Solver).systematic_branching_state = 1;
  bVar8 = do_simp & this->use_simplification;
  dVar2 = cpuTime();
  lVar9 = (long)(this->super_Solver).trail.sz;
  if (bVar8 == 1) {
    for (lVar10 = 0; lVar10 < (this->super_Solver).assumptions.sz; lVar10 = lVar10 + 1) {
      v = (this->super_Solver).assumptions.data[lVar10].x >> 1;
      pcVar1 = (this->frozen).data;
      if (pcVar1[v] == '\0') {
        pcVar1[v] = '\x01';
        vec<int>::push(&extra_frozen,&v);
      }
    }
    bVar6 = eliminate(this,false);
    result.value = !bVar6;
  }
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  vec<char>::clear(&this->touched,true);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  vec<int>::clear(&this->n_occ,true);
  Heap<Minisat::SimpSolver::ElimLt>::clear(&this->elim_heap,true);
  Queue<unsigned_int>::clear(&this->subsumption_queue,true);
  dVar3 = cpuTime();
  (this->super_Solver).check_satisfiability_simplified = true;
  if ((this->super_Solver).solves == 1) {
    this_00 = &(this->super_Solver).add_tmp;
    if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
      (this->super_Solver).add_tmp.sz = 0;
    }
    vec<Minisat::Lit>::push(this_00,(Lit *)&lit_Undef);
    for (; lVar9 < (this->super_Solver).trail.sz; lVar9 = lVar9 + 1) {
      ((this->super_Solver).add_tmp.data)->x = (this->super_Solver).trail.data[lVar9].x;
      Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>(&this->super_Solver,this_00,1);
    }
    if (this_00->data != (Lit *)0x0) {
      (this->super_Solver).add_tmp.sz = 0;
    }
  }
  bVar6 = lbool::operator==(&result,(lbool)0x0);
  if (bVar6) {
    result = Solver::solve_(&this->super_Solver);
  }
  else if (0 < (this->super_Solver).verbosity) {
    puts("c ===============================================================================");
  }
  dVar4 = cpuTime();
  bVar6 = lbool::operator==(&result,(lbool)0x0);
  if (bVar6) {
    extendModel(this);
    if ((this->super_Solver).check_satisfiability == true) {
      bVar6 = Solver::SATchecker::checkModel
                        (&(this->super_Solver).satChecker,&(this->super_Solver).model);
      if (!bVar6) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "ERROR: detected model that does not satisfy input formula, abort";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      if ((this->super_Solver).verbosity != 0) {
        puts("c validated SAT answer after extending model");
      }
    }
  }
  if (bVar8 != 0) {
    for (lVar9 = 0; lVar9 < extra_frozen.sz; lVar9 = lVar9 + 1) {
      setFrozen(this,extra_frozen.data[lVar9],false);
    }
  }
  (this->super_Solver).systematic_branching_state = 0;
  dVar5 = cpuTime();
  (this->super_Solver).statistics.simpSeconds =
       (dVar5 - (dVar4 - (dVar3 - dVar2))) + (this->super_Solver).statistics.simpSeconds;
  vec<int>::~vec(&extra_frozen);
  return (lbool)result.value;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool result = l_True;

    systematic_branching_state = 1;

    do_simp &= use_simplification;
    double simp_time = cpuTime();

    const int pre_simplification_units = trail.size();

    if (do_simp) {
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++) {
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]) {
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            }
        }

        result = lbool(eliminate(turn_off_simp));
    }
    occurs.clear(true);
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    simp_time = cpuTime() - simp_time;      // stop timer and record time consumed until now
    check_satisfiability_simplified = true; // only check SAT answer after the call to extendModel()

    /* share units during initial call, only really useful in case preprocessing is used */
    if (solves == 1) {
        assert(decisionLevel() == 0);
        add_tmp.clear();
        add_tmp.push(lit_Undef);
        for (int i = pre_simplification_units; i < trail.size(); ++i) {
            add_tmp[0] = trail[i];
            shareViaCallback(add_tmp, 1);
        }
        add_tmp.clear();
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("c ===============================================================================\n");

    simp_time = cpuTime() - simp_time; // continue timer and consider time tracked already

    if (result == l_True) {
        extendModel();
        if (check_satisfiability) {
            if (!satChecker.checkModel(model)) {
                assert(false && "model should satisfy full input formula");
                throw("ERROR: detected model that does not satisfy input formula, abort");
                exit(1);
            } else if (verbosity)
                printf("c validated SAT answer after extending model\n");
        }
    }

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++) setFrozen(extra_frozen[i], false);

    systematic_branching_state = 0;
    statistics.simpSeconds += cpuTime() - simp_time; // stop timer and record time consumed until now

    return result;
}